

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

bool __thiscall
ArgsManager::ReadSettingsFile
          (ArgsManager *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors)

{
  long lVar1;
  string_view logging_function;
  bool bVar2;
  undefined1 uVar3;
  byte bVar4;
  ArgsManager *this_00;
  iterator iVar5;
  iterator iVar6;
  reference ppVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *setting;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  read_errors;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  KeyInfo key;
  path path;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  char *in_stack_fffffffffffffe30;
  reference in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined2 in_stack_fffffffffffffe4c;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  pointer *errors_00;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  ArgsManager *in_stack_fffffffffffffe70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  bool local_131;
  ConstevalFormatString<1U> in_stack_fffffffffffffed8;
  string_view in_stack_fffffffffffffee0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff08;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *in_stack_ffffffffffffff10;
  path *in_stack_ffffffffffffff18;
  Level in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffffd0;
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  bVar2 = GetSettingsPath(in_stack_fffffffffffffe70,
                          (path *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                          SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0),
                          SUB81((ulong)in_stack_fffffffffffffe60 >> 0x30,0));
  if (bVar2) {
    this_00 = (ArgsManager *)
              MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                        ((AnnotatedMixin<std::recursive_mutex> *)
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
               in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50
               ,CONCAT13(in_stack_fffffffffffffe4f,
                         CONCAT12(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe4c)),
               SUB41((uint)in_stack_fffffffffffffe48 >> 0x18,0));
    errors_00 = &in_RDI[5].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    uVar3 = common::ReadSettings
                      (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08
                      );
    if ((bool)uVar3) {
      iVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                       *)in_stack_fffffffffffffe30);
      iVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                     *)in_stack_fffffffffffffe30);
      while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe38,
                                     (_Self *)in_stack_fffffffffffffe30), ((bVar2 ^ 0xffU) & 1) != 0
            ) {
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                              *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,in_stack_fffffffffffffe68));
        InterpretKey((string *)this_00);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        std::operator+((char)((ulong)in_RDI >> 0x38),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
        ;
        GetArgFlags(this_00,(string *)CONCAT17(uVar3,in_stack_fffffffffffffe68));
        bVar2 = std::optional::operator_cast_to_bool
                          ((optional<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        bVar4 = bVar2 ^ 0xff;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        if ((bVar4 & 1) != 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffe4e,
                                             CONCAT24(in_stack_fffffffffffffe4c,
                                                      in_stack_fffffffffffffe48))),
                     in_stack_fffffffffffffe40);
          in_stack_fffffffffffffe38 = ppVar7;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffe4e,
                                             CONCAT24(in_stack_fffffffffffffe4c,
                                                      in_stack_fffffffffffffe48))),
                     in_stack_fffffffffffffe40);
          in_stack_fffffffffffffe30 = "Ignoring unknown rw_settings value %s\n";
          in_stack_fffffffffffffe28 = 2;
          logging_function._M_str = (char *)iVar5._M_node;
          logging_function._M_len = (size_t)iVar6._M_node;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function,in_stack_fffffffffffffee0,
                     (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                     I2P|QT|PROXY|PRUNE|REINDEX|SELECTCOINS|ESTIMATEFEE|RPC|ZMQ,
                     in_stack_ffffffffffffffd0,in_stack_fffffffffffffed8,in_stack_ffffffffffffffe0);
        }
        KeyInfo::~KeyInfo((KeyInfo *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                      *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      }
      local_131 = true;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_01,in_RDI);
      SaveErrors((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)errors_00,in_stack_fffffffffffffe50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe38);
      local_131 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe38);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  }
  else {
    local_131 = true;
  }
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_131;
}

Assistant:

bool ArgsManager::ReadSettingsFile(std::vector<std::string>* errors)
{
    fs::path path;
    if (!GetSettingsPath(&path, /* temp= */ false)) {
        return true; // Do nothing if settings file disabled.
    }

    LOCK(cs_args);
    m_settings.rw_settings.clear();
    std::vector<std::string> read_errors;
    if (!common::ReadSettings(path, m_settings.rw_settings, read_errors)) {
        SaveErrors(read_errors, errors);
        return false;
    }
    for (const auto& setting : m_settings.rw_settings) {
        KeyInfo key = InterpretKey(setting.first); // Split setting key into section and argname
        if (!GetArgFlags('-' + key.name)) {
            LogPrintf("Ignoring unknown rw_settings value %s\n", setting.first);
        }
    }
    return true;
}